

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O3

int VP8GetCostUV(VP8EncIterator *it,VP8ModeScore *rd)

{
  int iVar1;
  VP8Encoder *pVVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  VP8Residual res;
  VP8Residual local_60;
  
  pVVar2 = it->enc_;
  VP8IteratorNzToBytes(it);
  local_60.coeff_type = 2;
  local_60.prob = (pVVar2->proba_).coeffs_[2];
  local_60.stats = (pVVar2->proba_).stats_[2];
  local_60.costs = (pVVar2->proba_).remapped_costs_[2];
  local_60.first = 0;
  uVar7 = 0;
  iVar8 = 0;
  bVar5 = true;
  do {
    bVar4 = bVar5;
    uVar12 = 0;
    bVar5 = true;
    do {
      bVar9 = bVar5;
      uVar10 = uVar12 | uVar7 | 4;
      uVar11 = 0;
      bVar5 = true;
      do {
        bVar3 = bVar5;
        uVar13 = uVar11 | uVar7 | 4;
        iVar6 = it->left_nz_[uVar10];
        iVar1 = it->top_nz_[uVar13];
        (*VP8SetResidualCoeffs)(rd->uv_levels[uVar11 | (uVar12 | uVar7) * 2],&local_60);
        iVar6 = (*VP8GetResidualCost)(iVar6 + iVar1,&local_60);
        iVar8 = iVar8 + iVar6;
        it->left_nz_[uVar10] = (uint)~local_60.last >> 0x1f;
        it->top_nz_[uVar13] = (uint)~local_60.last >> 0x1f;
        uVar11 = 1;
        bVar5 = false;
      } while (bVar3);
      uVar12 = 1;
      bVar5 = false;
    } while (bVar9);
    uVar7 = 2;
    bVar5 = false;
  } while (bVar4);
  return iVar8;
}

Assistant:

int VP8GetCostUV(VP8EncIterator* const it, const VP8ModeScore* const rd) {
  VP8Residual res;
  VP8Encoder* const enc = it->enc_;
  int ch, x, y;
  int R = 0;

  VP8IteratorNzToBytes(it);  // re-import the non-zero context

  VP8InitResidual(0, 2, enc, &res);
  for (ch = 0; ch <= 2; ch += 2) {
    for (y = 0; y < 2; ++y) {
      for (x = 0; x < 2; ++x) {
        const int ctx = it->top_nz_[4 + ch + x] + it->left_nz_[4 + ch + y];
        VP8SetResidualCoeffs(rd->uv_levels[ch * 2 + x + y * 2], &res);
        R += VP8GetResidualCost(ctx, &res);
        it->top_nz_[4 + ch + x] = it->left_nz_[4 + ch + y] = (res.last >= 0);
      }
    }
  }
  return R;
}